

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O1

char * stb_stristr(char *s,char *t)

{
  char t_00;
  int iVar1;
  size_t __n;
  char *__s1;
  
  __n = strlen(t);
  if (__n != 0) {
    t_00 = *t;
    for (__s1 = stb_strichr(s,t_00); __s1 != (char *)0x0; __s1 = stb_strichr(__s1 + 1,t_00)) {
      iVar1 = strncasecmp(__s1,t,__n);
      if (iVar1 == 0) {
        return __s1;
      }
    }
    s = (char *)0x0;
  }
  return s;
}

Assistant:

char *stb_stristr(char *s, char *t)
{
   size_t n = strlen(t);
   char *z;
   if (n==0) return s;
   while ((z = stb_strichr(s, *t)) != NULL) {
      if (0==stb_strnicmp(z, t, n))
         return z;
      s = z+1;
   }
   return NULL;
}